

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O2

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int iVar1;
  int iVar2;
  stbi__context *__src;
  stbi_uc *psVar3;
  int *piVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  long lVar8;
  size_t __size;
  int iVar9;
  uchar *image;
  long *in_FS_OFFSET;
  uchar *local_89b0;
  size_t local_8998;
  stbi__context s;
  stbi__gif local_88a0;
  
  s.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  s.read_from_callbacks = 0;
  s.callback_already_read = 0;
  s.img_buffer_end = buffer + len;
  piVar5 = y;
  s.img_buffer = buffer;
  s.img_buffer_original = buffer;
  s.img_buffer_original_end = s.img_buffer_end;
  iVar2 = stbi__gif_test(&s);
  if (iVar2 == 0) {
    in_FS_OFFSET[-4] = (long)"not GIF";
    local_89b0 = (uchar *)0x0;
  }
  else {
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    local_8998 = 4;
    lVar6 = 0;
    local_89b0 = (uchar *)0x0;
    lVar8 = 0;
    while( true ) {
      __src = (stbi__context *)stbi__gif_load_next(&s,&local_88a0,comp,(int)lVar8,(stbi_uc *)piVar5)
      ;
      iVar2 = (int)lVar6;
      if ((__src == &s) || (__src == (stbi__context *)0x0)) break;
      *x = local_88a0.w;
      *y = local_88a0.h;
      iVar7 = local_88a0.h * local_88a0.w;
      iVar1 = iVar7 * 4;
      __size = (size_t)((iVar2 + 1) * iVar1);
      if (local_89b0 == (uchar *)0x0) {
        local_89b0 = (uchar *)malloc(__size);
        if (local_89b0 != (stbi_uc *)0x0) {
          if (delays != (int **)0x0) {
            piVar4 = (int *)malloc(local_8998);
            *delays = piVar4;
            if (piVar4 == (int *)0x0) goto LAB_00105f5c;
          }
          goto LAB_00105e69;
        }
        stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
LAB_00105f89:
        local_89b0 = (uchar *)0x0;
        goto LAB_00105f8e;
      }
      psVar3 = (stbi_uc *)realloc(local_89b0,__size);
      if (psVar3 == (stbi_uc *)0x0) {
LAB_00105f5c:
        stbi__load_gif_main_outofmem(&local_88a0,local_89b0,delays);
        goto LAB_00105f89;
      }
      local_89b0 = psVar3;
      if (delays != (int **)0x0) {
        piVar4 = (int *)realloc(*delays,local_8998);
        if (piVar4 == (int *)0x0) goto LAB_00105f5c;
        *delays = piVar4;
      }
LAB_00105e69:
      memcpy(local_89b0 + iVar2 * iVar1,__src,(long)iVar1);
      if (lVar6 != 0) {
        lVar8 = (long)local_89b0 - (long)(iVar7 * 8);
      }
      if (delays != (int **)0x0) {
        (*delays)[lVar6] = local_88a0.delay;
      }
      local_8998 = local_8998 + 4;
      lVar6 = lVar6 + 1;
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b0 = stbi__convert_format(local_89b0,4,req_comp,local_88a0.w * iVar2,local_88a0.h);
    }
    *z = iVar2;
  }
LAB_00105f8e:
  piVar5 = &stbi__vertically_flip_on_load_global;
  if (*(int *)((long)in_FS_OFFSET + -0x14) != 0) {
    piVar5 = (int *)(*in_FS_OFFSET + -0x18);
  }
  if (*piVar5 != 0) {
    iVar2 = *x;
    iVar1 = *y;
    iVar7 = *comp;
    image = local_89b0;
    iVar9 = 0;
    if (0 < *z) {
      iVar9 = *z;
    }
    while (iVar9 != 0) {
      stbi__vertical_flip(image,iVar2,iVar1,iVar7);
      image = image + iVar1 * iVar2 * iVar7;
      iVar9 = iVar9 + -1;
    }
  }
  return local_89b0;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}